

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void acc_stat_highbd_sse41(int64_t *dst,uint16_t *dgd,__m128i *shuffle,__m128i *dgd_ijkl)

{
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  void *in_RSI;
  void *pvVar1;
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i rhh;
  __m128i rhl;
  __m128i rlh;
  __m128i rll;
  __m128i dhh;
  __m128i dhl;
  __m128i dlh;
  __m128i dll;
  __m128i dh;
  __m128i dl;
  __m128i s1h;
  __m128i s1l;
  __m128i s0h;
  __m128i s0l;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  
  pvVar1 = in_RSI;
  xx_loadu_128(in_RSI);
  xx_loadu_128((void *)((long)in_RSI + 8));
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = extraout_XMM0_Qa;
  auVar2 = pshufb(auVar2,*in_RDX);
  auVar3._8_8_ = extraout_XMM0_Qb_00;
  auVar3._0_8_ = extraout_XMM0_Qa_00;
  auVar3 = pshufb(auVar3,*in_RDX);
  auVar2 = pmaddwd(*in_RCX,auVar2);
  auVar3 = pmaddwd(*in_RCX,auVar3);
  local_58 = auVar2._0_8_;
  pmovzxdq(auVar2,local_58);
  local_68 = auVar2._8_8_;
  pmovzxdq(auVar2 >> 0x40,local_68);
  local_78 = auVar3._0_8_;
  pmovzxdq(auVar3,local_78);
  local_88 = auVar3._8_8_;
  pmovzxdq(auVar3 >> 0x40,local_88);
  alVar4 = xx_loadu_128(in_RDI);
  alVar4[0] = (longlong)pvVar1;
  xx_storeu_128(in_RDI,alVar4);
  alVar4 = xx_loadu_128((void *)((long)in_RDI + 0x10));
  v[1] = alVar4[1];
  v[0] = (longlong)pvVar1;
  xx_storeu_128((void *)((long)in_RDI + 0x10),v);
  alVar4 = xx_loadu_128((void *)((long)in_RDI + 0x20));
  v_00[1] = alVar4[1];
  v_00[0] = (longlong)pvVar1;
  xx_storeu_128((void *)((long)in_RDI + 0x20),v_00);
  alVar4 = xx_loadu_128((void *)((long)in_RDI + 0x30));
  v_01[1] = alVar4[1];
  v_01[0] = (longlong)pvVar1;
  xx_storeu_128((void *)((long)in_RDI + 0x30),v_01);
  return;
}

Assistant:

static inline void acc_stat_highbd_sse41(int64_t *dst, const uint16_t *dgd,
                                         const __m128i *shuffle,
                                         const __m128i *dgd_ijkl) {
  // Load 256 bits from dgd in two chunks
  const __m128i s0l = xx_loadu_128(dgd);
  const __m128i s0h = xx_loadu_128(dgd + 4);
  // s0l = [7 6 5 4 3 2 1 0] as u16 values (dgd indices)
  // s0h = [11 10 9 8 7 6 5 4] as u16 values (dgd indices)
  // (Slightly strange order so we can apply the same shuffle to both halves)

  // Shuffle the u16 values in each half (actually using 8-bit shuffle mask)
  const __m128i s1l = _mm_shuffle_epi8(s0l, *shuffle);
  const __m128i s1h = _mm_shuffle_epi8(s0h, *shuffle);
  // s1l = [4 3 3 2 2 1 1 0] as u16 values (dgd indices)
  // s1h = [8 7 7 6 6 5 5 4] as u16 values (dgd indices)

  // Multiply s1 by dgd_ijkl resulting in 8x u32 values
  // Horizontally add pairs of u32 resulting in 4x u32
  const __m128i dl = _mm_madd_epi16(*dgd_ijkl, s1l);
  const __m128i dh = _mm_madd_epi16(*dgd_ijkl, s1h);
  // dl = [d c b a] as u32 values
  // dh = [h g f e] as u32 values

  // Add these 8x u32 results on to dst in four parts
  const __m128i dll = _mm_cvtepu32_epi64(dl);
  const __m128i dlh = _mm_cvtepu32_epi64(_mm_srli_si128(dl, 8));
  const __m128i dhl = _mm_cvtepu32_epi64(dh);
  const __m128i dhh = _mm_cvtepu32_epi64(_mm_srli_si128(dh, 8));
  // dll = [b a] as u64 values, etc.

  const __m128i rll = _mm_add_epi64(xx_loadu_128(dst), dll);
  xx_storeu_128(dst, rll);
  const __m128i rlh = _mm_add_epi64(xx_loadu_128(dst + 2), dlh);
  xx_storeu_128(dst + 2, rlh);
  const __m128i rhl = _mm_add_epi64(xx_loadu_128(dst + 4), dhl);
  xx_storeu_128(dst + 4, rhl);
  const __m128i rhh = _mm_add_epi64(xx_loadu_128(dst + 6), dhh);
  xx_storeu_128(dst + 6, rhh);
}